

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACInfoWnd.cpp
# Opt level: O2

void __thiscall ACIWnd::SetAcKey(ACIWnd *this,FDKeyTy *_key)

{
  FDKeyTy *pFVar1;
  string local_30;
  
  ClearAcKey(this);
  pFVar1 = LTFlightData::FDKeyTy::operator=(&this->acKey,_key);
  std::__cxx11::string::string((string *)&local_30,(string *)&pFVar1->key);
  std::__cxx11::string::operator=((string *)&this->keyEntry,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  GetWndTitle_abi_cxx11_(&local_30,this);
  ImgWindow::SetWindowTitle((ImgWindow *)this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  LTImgWindow::ReturnKeyboardFocus(&this->super_LTImgWindow);
  DataRefs::LTSetAcKey((void *)0x0,(int)(this->acKey).num);
  return;
}

Assistant:

void ACIWnd::SetAcKey (const LTFlightData::FDKeyTy& _key)
{
    ClearAcKey();                   // clear a lot of data
    keyEntry = (acKey = _key);      // remember the key
    SetWindowTitle(GetWndTitle());  // set the window's title
    ReturnKeyboardFocus();          // give up keyboard focus in case we had it

    // set as 'selected' aircraft for debug output
    dataRefs.LTSetAcKey(reinterpret_cast<void*>(long(DR_AC_KEY)),
                        (int)acKey.num);
}